

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

void flatbuffers::java::GenStructBody(StructDef *struct_def,string *code_ptr,char *nameprefix)

{
  StructDef *struct_def_00;
  string *__lhs;
  char *code_ptr_00;
  bool bVar1;
  reference ppFVar2;
  char *nameprefix_00;
  FieldDef *field_00;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  FieldDef *local_b0;
  FieldDef *field;
  const_reverse_iterator it;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  char *nameprefix_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  
  local_28 = code_ptr;
  code = (string *)nameprefix;
  nameprefix_local = (char *)code_ptr;
  code_ptr_local = (string *)struct_def;
  NumToString<unsigned_long>(&local_88,struct_def->minalign);
  std::operator+(&local_68,"    builder.prep(",&local_88);
  std::operator+(&local_48,&local_68,", 0);\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
             &stack0xffffffffffffff60);
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&stack0xffffffffffffff60,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar1) break;
    ppFVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)&stack0xffffffffffffff60);
    local_b0 = *ppFVar2;
    if (local_b0->padding != 0) {
      NumToString<unsigned_long>(&local_110,local_b0->padding);
      std::operator+(&local_f0,"    builder.pad(",&local_110);
      std::operator+(&local_d0,&local_f0,");\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    bVar1 = IsStruct(&(local_b0->value).type);
    code_ptr_00 = nameprefix_local;
    if (bVar1) {
      struct_def_00 = (local_b0->value).type.struct_def;
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     struct_def_00,"_");
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      GenStructBody(struct_def_00,(string *)code_ptr_00,nameprefix_00);
      std::__cxx11::string::~string((string *)&local_130);
    }
    else {
      GenMethod_abi_cxx11_(&local_190,(java *)local_b0,field_00);
      std::operator+(&local_170,"    builder.put",&local_190);
      std::operator+(&local_150,&local_170,"(");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      __lhs = code;
      MakeCamel(&local_1f0,(string *)local_b0,false);
      std::operator+(&local_1d0,(char *)__lhs,&local_1f0);
      std::operator+(&local_1b0,&local_1d0,");\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)&stack0xffffffffffffff60);
  }
  return;
}

Assistant:

static void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                          const char *nameprefix) {
  std::string &code = *code_ptr;
  code += "    builder.prep(" + NumToString(struct_def.minalign) + ", 0);\n";
  for (auto it = struct_def.fields.vec.rbegin();
       it != struct_def.fields.vec.rend();
       ++it) {
    auto &field = **it;
    if (field.padding)
      code += "    builder.pad(" + NumToString(field.padding) + ");\n";
    if (IsStruct(field.value.type)) {
      GenStructBody(*field.value.type.struct_def, code_ptr,
                    (field.value.type.struct_def->name + "_").c_str());
    } else {
      code += "    builder.put" + GenMethod(field) + "(";
      code += nameprefix + MakeCamel(field.name, false) + ");\n";
    }
  }
}